

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::PoolingLayerParams::Clear(PoolingLayerParams *this)

{
  (this->kernelsize_).current_size_ = 0;
  (this->stride_).current_size_ = 0;
  this->type_ = 0;
  this->avgpoolexcludepadding_ = false;
  this->globalpooling_ = false;
  clear_PoolingPaddingType(this);
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void PoolingLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.PoolingLayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  kernelsize_.Clear();
  stride_.Clear();
  ::memset(&type_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&globalpooling_) -
      reinterpret_cast<char*>(&type_)) + sizeof(globalpooling_));
  clear_PoolingPaddingType();
  _internal_metadata_.Clear<std::string>();
}